

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument_factory.hpp
# Opt level: O1

void __thiscall
boost::runtime::argument_factory<boost::unit_test::report_level,_true,_false>::produce_argument
          (argument_factory<boost::unit_test::report_level,_true,_false> *this,cstring *source,
          cstring *param_name,arguments_store *store)

{
  report_level local_3c;
  cstring local_38;
  cstring local_28;
  cstring local_18;
  
  local_38.m_begin = param_name->m_begin;
  local_38.m_end = param_name->m_end;
  if (source->m_end == source->m_begin) {
    local_3c = this->m_optional_value;
  }
  else {
    local_28.m_begin = source->m_begin;
    local_28.m_end = source->m_end;
    local_18.m_begin = local_38.m_begin;
    local_18.m_end = local_38.m_end;
    local_3c = value_interpreter<boost::unit_test::report_level,_true>::interpret
                         (&this->m_interpreter,&local_18,&local_28);
  }
  arguments_store::set<boost::unit_test::report_level>(store,&local_38,&local_3c);
  return;
}

Assistant:

void        produce_argument( cstring source, cstring param_name, arguments_store& store ) const
    {
        store.set( param_name, source.empty() ? m_optional_value : m_interpreter.interpret( param_name, source ) );
    }